

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::UnCamelCaseEnumShortName(string *name)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RSI;
  string *in_RDI;
  char c;
  int i;
  string *result;
  int local_18;
  
  std::__cxx11::string::string((string *)in_RDI);
  for (local_18 = 0; uVar3 = std::__cxx11::string::size(), (ulong)(long)local_18 < uVar3;
      local_18 = local_18 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    if ((0 < local_18) && (bVar1 = ascii_isupper(*pcVar4), bVar1)) {
      std::__cxx11::string::operator+=((string *)in_RDI,'_');
    }
    cVar2 = ascii_toupper('\0');
    std::__cxx11::string::operator+=((string *)in_RDI,cVar2);
  }
  return in_RDI;
}

Assistant:

string UnCamelCaseEnumShortName(const string& name) {
  string result;
  for (int i = 0; i < name.size(); i++) {
    char c = name[i];
    if (i > 0 && ascii_isupper(c)) {
      result += '_';
    }
    result += ascii_toupper(c);
  }
  return result;
}